

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IElseReader.cpp
# Opt level: O0

void __thiscall IElseReader::getWord(IElseReader *this,string *str)

{
  char cVar1;
  bool bVar2;
  int local_24;
  int local_20;
  int i;
  int num_3l;
  char tempChar;
  string *str_local;
  IElseReader *this_local;
  
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    cVar1 = std::istream::get();
    std::__cxx11::string::operator+=((string *)str,cVar1);
  }
  bVar2 = std::operator!=(str,"else");
  if (bVar2) {
    std::__cxx11::string::operator=((string *)str,"");
  }
  else {
    while( true ) {
      i._3_1_ = std::istream::get();
      bVar2 = IDictionary::isBlankSep(i._3_1_);
      if (!bVar2) break;
      std::__cxx11::string::operator+=((string *)str,i._3_1_);
      if (i._3_1_ == '\n') {
        std::__cxx11::string::operator+=((string *)str,'\n');
      }
    }
    if (i._3_1_ == '{') {
      std::__cxx11::string::operator+=((string *)str,'{');
      local_20 = 1;
      while (cVar1 = std::istream::get(), cVar1 != -1 && local_20 != 0) {
        std::__cxx11::string::operator+=((string *)str,cVar1);
        if (cVar1 == '\n') {
          std::__cxx11::string::operator+=((string *)str,'\n');
        }
        else if (cVar1 == '}') {
          local_20 = local_20 + -1;
        }
      }
    }
    else if (i._3_1_ == ';') {
      std::__cxx11::string::operator+=((string *)str,';');
    }
    else {
      do {
        std::__cxx11::string::operator+=((string *)str,i._3_1_);
        i._3_1_ = std::istream::get();
      } while (i._3_1_ != ';');
    }
  }
  return;
}

Assistant:

void IElseReader::getWord(std::string &str) {
    char tempChar;
    int num_3l;

    for(int i=0;i<4;i++)
    {
        tempChar=m_ifs->get();
        str+=tempChar;
    }
    if(str!="else") {
        str = "";
        return;
    }
    while(true)
    {
        tempChar=m_ifs->get();
        if(IDictionary::isBlankSep(tempChar))
        {
            str+=tempChar;
            if(tempChar=='\n')
                str+='\n';
        }
        else
            break;
    }

    if(tempChar=='{')
    {
        str+=tempChar;
        num_3l=1;

        while ((tempChar=m_ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=m_ifs->get();
        }while (tempChar!=';');
    }
}